

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Vector.cpp
# Opt level: O3

LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> * __thiscall
KDIS::DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)'\x03'>_>::operator-=
          (LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> *this,
          LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> *Value)

{
  KFIXED<char,_(unsigned_char)__x03_> KStack_b8;
  KFIXED<char,_(unsigned_char)__x03_> local_a8;
  KFIXED<char,_(unsigned_char)__x03_> local_98;
  DataTypeBase local_88;
  char local_80;
  KFIXED<char,_(unsigned_char)__x03_> local_78;
  DataTypeBase local_68;
  char local_60;
  KFIXED<char,_(unsigned_char)__x03_> local_58;
  DataTypeBase local_48;
  char local_40;
  KFIXED<char,_(unsigned_char)__x03_> local_38;
  
  local_48._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00223c28;
  local_40 = (Value->m_X).m_Val;
  KFIXED<char,_(unsigned_char)'\x03'>::operator-(&local_98,&this->m_X);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_38,&this->m_X);
  DataTypeBase::~DataTypeBase(&local_38.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_98.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_48);
  local_68._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00223c28;
  local_60 = (Value->m_Y).m_Val;
  KFIXED<char,_(unsigned_char)'\x03'>::operator-(&local_a8,&this->m_Y);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_58,&this->m_Y);
  DataTypeBase::~DataTypeBase(&local_58.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_a8.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_68);
  local_88._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00223c28;
  local_80 = (Value->m_Z).m_Val;
  KFIXED<char,_(unsigned_char)'\x03'>::operator-(&KStack_b8,&this->m_Z);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_78,&this->m_Z);
  DataTypeBase::~DataTypeBase(&local_78.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&KStack_b8.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_88);
  return this;
}

Assistant:

LE_Vector<Type> & LE_Vector<Type>::operator -= ( const LE_Vector & Value )
{
    m_X = m_X - Value.m_X;
    m_Y = m_Y - Value.m_Y;
    m_Z = m_Z - Value.m_Z;
    return *this;
}